

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertiesIterator.h
# Opt level: O2

PropertiesIterator * __thiscall Rml::PropertiesIterator::operator++(PropertiesIterator *this)

{
  Iter<true> *this_00;
  
  this_00 = &this->it_style;
  if ((this->it_style).mKeyVals == (this->it_style_end).mKeyVals) {
    this_00 = &this->it_definition;
  }
  robin_hood::detail::
  Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
  ::Iter<true>::operator++(this_00);
  ProceedToNextValid(this);
  return this;
}

Assistant:

PropertiesIterator& operator++()
	{
		if (it_style != it_style_end)
			// We iterate over the local style properties first
			++it_style;
		else
			// .. and then over the properties given by the element's definition
			++it_definition;
		// If we reached the end of one of the iterator pairs, we need to continue iteration on the next pair.
		ProceedToNextValid();
		return *this;
	}